

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cat.cpp
# Opt level: O3

bool __thiscall CmdCat::Execute(CmdCat *this)

{
  char cVar1;
  FileType FVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  _List_node_base *p_Var6;
  char *pcVar7;
  char t;
  ifstream fin;
  char local_242;
  char local_241;
  _List_node_base *local_240;
  char local_238 [520];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    if ((this->super_Command).parameter.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size != 0) {
      local_240 = (_List_node_base *)&(this->super_Command).parameter;
      p_Var6 = (((StrList *)local_240)->
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var6 == local_240) {
        return true;
      }
      do {
        FVar2 = DirUtils::GetFileType((string *)(p_Var6 + 1));
        if (FVar2 == DU_DIRECTORY) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cat: ",5);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)p_Var6[1]._M_next,
                              (long)p_Var6[1]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Is a directory",0x10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        else {
          std::ifstream::ifstream(local_238,(((string *)(p_Var6 + 1))->_M_dataplus)._M_p,_S_bin);
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cat: ",5);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var6[1]._M_next,
                                (long)p_Var6[1]._M_prev);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,": No such file or directory",0x1b);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          else {
            while (plVar4 = (long *)std::istream::read(local_238,(long)&local_242),
                  (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
              local_241 = local_242;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_241,1)
              ;
            }
            std::ifstream::close();
          }
          std::ifstream::~ifstream(local_238);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != local_240);
      return true;
    }
    pcVar7 = "cat: too few arguments given";
    lVar5 = 0x1c;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cat: invalid option -- \'",0x18);
    p_Var6 = (this->super_Command).option.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var6[1]._M_next,(long)p_Var6[1]._M_prev);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar7 = "Try \'cat -- help\' for more information.";
    lVar5 = 0x27;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return false;
}

Assistant:

bool CmdCat::Execute(){
	if(option.size() != 0){	
		cout << "cat: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cat -- help' for more information." << endl;
		return false;
	}
	
	if(parameter.size() == 0){	
		cout << "cat: too few arguments given" << endl;
		return false;
	}

	for(auto i = parameter.begin(); i != parameter.end(); i++){
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "cat: " << (*i) << ": Is a directory" << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "cat: " << (*i) << ": No such file or directory" << endl;
			continue;
		}
		char t;
		while(fin.read(&t, sizeof(t))){
			cout << t;
		}
		fin.close();
	}

	return true;
}